

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qminimalbackingstore.cpp
# Opt level: O1

void __thiscall
QMinimalBackingStore::resize(QMinimalBackingStore *this,QSize *size,QRegion *param_2)

{
  Format FVar1;
  long *plVar2;
  undefined8 uVar3;
  long in_FS_OFFSET;
  QImage local_60 [16];
  undefined8 local_50;
  code *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QGuiApplication::primaryScreen();
  plVar2 = (long *)QScreen::handle();
  FVar1 = (**(code **)(*plVar2 + 0x38))(plVar2);
  uVar3 = QImage::size();
  if (((size->wd).m_i != (int)uVar3) || ((size->ht).m_i != (int)((ulong)uVar3 >> 0x20))) {
    QImage::QImage(local_60,size,FVar1);
    local_38 = 0xaaaaaaaaaaaaaaaa;
    local_48 = (code *)0xaaaaaaaaaaaaaaaa;
    uStack_40 = 0xaaaaaaaaaaaaaaaa;
    QPaintDevice::QPaintDevice((QPaintDevice *)&local_48);
    uVar3 = local_50;
    local_48 = QString::fromUtf8;
    local_50 = 0;
    local_38 = *(undefined8 *)&this->field_0x20;
    *(undefined8 *)&this->field_0x20 = uVar3;
    QImage::~QImage((QImage *)&local_48);
    QImage::~QImage(local_60);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMinimalBackingStore::resize(const QSize &size, const QRegion &)
{
    QImage::Format format = QGuiApplication::primaryScreen()->handle()->format();
    if (mImage.size() != size)
        mImage = QImage(size, format);
}